

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O1

uint32_t helper_v7m_mrs_arm(CPUARMState *env,uint32_t reg)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  
  uVar4 = env->features;
  uVar3 = (uint)uVar4;
  if ((uVar3 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      if ((env->uncached_cpsr & 0x1f) == 0x10) {
        uVar6 = 0;
      }
      else {
        uVar6 = 1;
      }
    }
    else {
      uVar6 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar6 = 1;
    if ((env->v7m).exception == 0) {
      uVar6 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
  if (reg < 8) {
    uVar3 = 0x1ff;
    if (uVar6 == 0) {
      uVar3 = 0;
    }
    if ((reg & 1) == 0) {
      uVar3 = 0;
    }
    uVar6 = 0xf80f0000;
    if ((uVar4 >> 0x22 & 1) == 0) {
      uVar6 = 0xf8000000;
    }
    if (3 < reg) {
      uVar6 = 0;
    }
    return (env->GE << 0x10 | env->thumb << 0x18 | env->QF << 0x1b |
            env->VF >> 3 & 0x10000000 |
            env->CF << 0x1d | (uint)(env->ZF == 0) << 0x1e | env->NF & 0x80000000 |
           (env->v7m).exception) & (uVar6 | uVar3);
  }
  if (reg == 0x94) {
    if ((env->v7m).secure != 0) {
      return (env->v7m).control[1] & 4 | (env->v7m).control[0];
    }
    return 0;
  }
  if (reg == 0x14) {
    uVar4 = (ulong)(env->v7m).secure;
    uVar3 = (env->v7m).control[uVar4];
    if (uVar4 != 0) {
      return uVar3;
    }
    return uVar3 | (env->v7m).control[1] & 4;
  }
  if (uVar6 == 0) {
    return 0;
  }
  if ((uVar4 >> 0x25 & 1) == 0) {
    switch(reg) {
    case 8:
      goto switchD_0059878c_caseD_8;
    case 9:
      goto switchD_0059878c_caseD_9;
    case 10:
      goto switchD_0059878c_caseD_a;
    case 0xb:
      goto switchD_0059878c_caseD_b;
    default:
      goto switchD_0059878c_caseD_c;
    case 0x10:
      goto switchD_0059878c_caseD_10;
    case 0x11:
    case 0x12:
      goto switchD_0059878c_caseD_11;
    case 0x13:
      goto switchD_0059878c_caseD_13;
    }
  }
  switch(reg) {
  case 8:
    goto switchD_0059878c_caseD_8;
  case 9:
switchD_0059878c_caseD_9:
    lVar2 = 0xb18;
    if ((env->v7m).exception != 0) goto LAB_00598886;
    bVar1 = (byte)(env->v7m).control[(env->v7m).secure];
    lVar5 = 0xb18;
    lVar2 = 0x34;
    goto LAB_00598882;
  case 10:
switchD_0059878c_caseD_a:
    if ((uVar3 >> 0x1b & 1) != 0) {
      return (env->v7m).msplim[(env->v7m).secure];
    }
    break;
  case 0xb:
switchD_0059878c_caseD_b:
    if ((uVar3 >> 0x1b & 1) != 0) {
      return (env->v7m).psplim[(env->v7m).secure];
    }
    break;
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    break;
  case 0x10:
switchD_0059878c_caseD_10:
    return (env->v7m).primask[(env->v7m).secure];
  case 0x11:
  case 0x12:
switchD_0059878c_caseD_11:
    return (env->v7m).basepri[(env->v7m).secure];
  case 0x13:
switchD_0059878c_caseD_13:
    return (env->v7m).faultmask[(env->v7m).secure];
  default:
    switch(reg) {
    case 0x88:
      if ((env->v7m).secure != 0) {
LAB_005987eb:
        return (env->v7m).other_ss_msp;
      }
      break;
    case 0x89:
      if ((env->v7m).secure != 0) {
LAB_00598933:
        return (env->v7m).other_ss_psp;
      }
      break;
    case 0x8a:
      if ((env->v7m).secure != 0) {
        return (env->v7m).msplim[0];
      }
      break;
    case 0x8b:
      if ((env->v7m).secure != 0) {
        return (env->v7m).psplim[0];
      }
      break;
    case 0x90:
      if ((env->v7m).secure != 0) {
        return (env->v7m).primask[0];
      }
      break;
    case 0x91:
      if ((env->v7m).secure != 0) {
        return (env->v7m).basepri[0];
      }
      break;
    case 0x93:
      if ((env->v7m).secure != 0) {
        return (env->v7m).faultmask[0];
      }
      break;
    case 0x98:
      if ((env->v7m).secure != 0) {
        if (((env->v7m).exception == 0) && (((env->v7m).control[0] & 2) != 0)) goto LAB_00598933;
        goto LAB_005987eb;
      }
    }
  }
switchD_0059878c_caseD_c:
  return 0;
switchD_0059878c_caseD_8:
  lVar2 = 0x34;
  if ((env->v7m).exception != 0) goto LAB_00598886;
  bVar1 = (byte)(env->v7m).control[(env->v7m).secure];
  lVar5 = 0x34;
  lVar2 = 0xb18;
LAB_00598882:
  if ((bVar1 & 2) == 0) {
    lVar2 = lVar5;
  }
LAB_00598886:
  return *(uint32_t *)((long)env->regs + lVar2);
}

Assistant:

static inline int arm_feature(CPUARMState *env, int feature)
{
    return (env->features & (1ULL << feature)) != 0;
}